

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O3

int __thiscall
flow::RetInstr::clone(RetInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Value *result;
  RetInstr *this_00;
  
  result = (Value *)**(undefined8 **)(__fn + 0x50);
  this_00 = (RetInstr *)operator_new(0x68);
  RetInstr(this_00,result);
  (this->super_TerminateInstr).super_Instr.super_Value._vptr_Value = (_func_int **)this_00;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> RetInstr::clone() {
  return std::make_unique<RetInstr>(operand(0));
}